

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void do_incchr(int *ip)

{
  t_symbol *ptVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int h;
  int w;
  int y;
  int x;
  uchar buffer [32];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  uchar local_58 [40];
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar2 = pcx_get_args(ip);
  if (iVar2 != 0) {
    iVar4 = 0;
    iVar2 = pcx_parse_args(0,pcx_nb_args,&local_5c,&local_60,&local_64,&local_68,8);
    if (iVar2 != 0) {
      if (0 < local_68) {
        iVar7 = 0;
        iVar4 = 0;
        iVar2 = local_68;
        iVar3 = local_64;
        do {
          if (0 < iVar3) {
            iVar5 = 0;
            iVar6 = 0;
            do {
              iVar2 = pcx_pack_8x8_tile(local_58,local_5c + iVar5,local_60 + iVar7 * 8);
              iVar4 = iVar4 + iVar2;
              putbuffer(local_58,iVar2);
              iVar6 = iVar6 + 1;
              iVar5 = iVar5 + 8;
              iVar2 = local_68;
              iVar3 = local_64;
            } while (iVar6 < local_64);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar2);
      }
      ptVar1 = lablptr;
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 9)) {
          lastlabl->data_size = lastlabl->data_size + iVar4;
        }
      }
      else {
        lablptr->data_type = 9;
        ptVar1->data_size = iVar4;
      }
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
do_incchr(int *ip)
{
	unsigned char buffer[32];
	int i, j;
	int x, y, w, h;
	int tx, ty;
	int total = 0;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 8))
		return;

	/* pack data */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* tile coordinates */
			tx = x + (j << 3);
			ty = y + (i << 3);

			/* get tile */
			size   = pcx_pack_8x8_tile(buffer, tx, ty);
			total += size;

			/* store tile */
			putbuffer(buffer, size);
		}
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCCHR;
		lablptr->data_size = total;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCCHR)
				lastlabl->data_size += total;
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}